

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameDesc::find_local(CVmObjFrameDesc *this,vm_val_t *nval,CVmDbgFrameSymPtr *symp)

{
  int iVar1;
  char *pcVar2;
  CVmDbgFrameSymPtr *unaff_retaddr;
  size_t in_stack_00000008;
  size_t namelen;
  char *name;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffc8);
  if (pcVar2 == (char *)0x0) {
    err_throw(0);
  }
  vmb_get_len((char *)0x352008);
  iVar1 = find_local((CVmObjFrameDesc *)name,(textchar_t *)namelen,in_stack_00000008,unaff_retaddr);
  return iVar1;
}

Assistant:

int CVmObjFrameDesc::find_local(VMG_ const vm_val_t *nval,
                               CVmDbgFrameSymPtr *symp)
{
    /* make sure the name is a string */
    const char *name = nval->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* parse the length */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* look up the symbol */
    return find_local(vmg_ name, namelen, symp);
}